

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_umax32_ppc64(void *d,void *a,void *b,uint32_t desc)

{
  intptr_t oprsz_00;
  uint local_48;
  uint32_t dd;
  uint32_t bb;
  uint32_t aa;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (_bb = 0; _bb < oprsz_00; _bb = _bb + 4) {
    local_48 = *(uint *)((long)b + _bb);
    if (local_48 < *(uint *)((long)a + _bb)) {
      local_48 = *(uint *)((long)a + _bb);
    }
    *(uint *)((long)d + _bb) = local_48;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_umax32)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint32_t)) {
        uint32_t aa = *(uint32_t *)((char *)a + i);
        uint32_t bb = *(uint32_t *)((char *)b + i);
        uint32_t dd = aa > bb ? aa : bb;
        *(uint32_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}